

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

void __thiscall
duckdb::WindowSegmentTreePart::Finalize(WindowSegmentTreePart *this,Vector *result,idx_t count)

{
  aggregate_destructor_t p_Var1;
  AggregateInputData aggr_input_data;
  AggregateInputData local_38;
  
  local_38.bind_data.ptr = AggregateObject::GetFunctionData(this->aggr);
  local_38.allocator = this->allocator;
  local_38.combine_type = PRESERVE_INPUT;
  (*(this->aggr->function).finalize)(&this->statef,&local_38,result,count,0);
  p_Var1 = (this->aggr->function).destructor;
  if (p_Var1 != (aggregate_destructor_t)0x0) {
    (*p_Var1)(&this->statef,&local_38,count);
  }
  return;
}

Assistant:

void WindowSegmentTreePart::Finalize(Vector &result, idx_t count) {
	//	Finalise the result aggregates and write to result if write_result is set
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(statef, aggr_input_data, result, count, 0);

	//	Destruct the result aggregates
	if (aggr.function.destructor) {
		aggr.function.destructor(statef, aggr_input_data, count);
	}
}